

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O1

vector<Image,_std::allocator<Image>_> *
process_textures(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,
                vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
                *tex_buf,pair<Texture,_Texture> last_batch_pair,
                vector<Image,_std::allocator<Image>_> *out_buf,Shader s,int starting_index)

{
  pointer *ppIVar1;
  long lVar2;
  iterator __position;
  Texture2D texture;
  Texture2D texture_00;
  Texture2D texture_01;
  Texture2D texture_02;
  Texture2D texture_03;
  Texture2D texture_04;
  Texture2D texture_05;
  Texture2D texture_06;
  Texture2D texture_07;
  RenderTexture2D target_00;
  RenderTexture2D target_01;
  RenderTexture2D target_02;
  RenderTexture2D target_03;
  Texture2D texture_08;
  Image image;
  Image image_00;
  Image image_01;
  Texture2D texture_09;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  code cVar6;
  int iVar7;
  ostream *poVar8;
  pointer ppVar9;
  uint uVar10;
  ulong uVar11;
  int *piVar12;
  pointer ppVar13;
  Shader shader;
  Shader shader_00;
  Shader shader_01;
  int log_index;
  Texture2D fg_previous;
  Texture2D bg;
  Texture2D fg;
  RenderTexture2D target;
  RenderTexture2D sampler;
  uint uVar14;
  int in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe1c;
  int iVar15;
  int iVar16;
  undefined4 uStack_1d4;
  void *local_1c8;
  int iStack_1c0;
  int iStack_1bc;
  int local_1b8;
  Texture local_1a8 [3];
  Texture local_168;
  undefined8 local_148;
  undefined8 uStack_140;
  int local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  Image local_100;
  int local_d8;
  int local_b8;
  int local_98;
  RenderTexture2D local_90;
  RenderTexture2D local_60;
  
  piVar12 = s.locs;
  uVar10 = s.id;
  LoadRenderTexture(&local_60,(int)(res.x + res.x),(int)(res.y * 3.0));
  LoadRenderTexture(&local_90,(int)res.x,(int)res.y);
  local_1a8[0].format = last_batch_pair.first.format;
  local_1a8[0].id = last_batch_pair.first.id;
  local_1a8[0].width = last_batch_pair.first.width;
  local_1a8[0].height = last_batch_pair.first.height;
  local_1a8[0].mipmaps = last_batch_pair.first.mipmaps;
  local_168.format = last_batch_pair.second.format;
  local_168.id = last_batch_pair.second.id;
  local_168.width = last_batch_pair.second.width;
  local_168.height = last_batch_pair.second.height;
  local_168.mipmaps = last_batch_pair.second.mipmaps;
  ppVar13 = (tex_buf->
            super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ppVar13->first).height;
  uVar4 = (ppVar13->first).mipmaps;
  uVar5 = (ppVar13->first).format;
  texture_06.height = uVar5;
  texture_06.width = uVar4;
  texture_06.id = uVar3;
  texture_09.id = (ppVar13->first).id;
  texture_09.width = (ppVar13->first).width;
  texture_09.height = (ppVar13->first).height;
  texture_09.mipmaps = (ppVar13->first).mipmaps;
  texture_09.format = (ppVar13->first).format;
  local_1b8 = (ppVar13->second).format;
  local_1c8 = *(void **)&ppVar13->second;
  iStack_1c0 = (ppVar13->second).height;
  iStack_1bc = (ppVar13->second).mipmaps;
  iVar15 = starting_index;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"processing inputs ",0x12);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,starting_index);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," to ",4);
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  ppVar13 = (tex_buf->
            super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  iVar16 = (int)tex_buf;
  uStack_1d4 = (undefined4)((ulong)tex_buf >> 0x20);
  if (ppVar13 !=
      (tex_buf->
      super__Vector_base<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tprocessing ",0xc);
      lVar2 = *(long *)(std::cout + -0x18);
      if ((&DAT_001ee459)[lVar2] == '\0') {
        cVar6 = (code)std::ios::widen((char)lVar2 + 'x');
        pthread_key_create[lVar2] = cVar6;
        (&DAT_001ee459)[lVar2] = 1;
      }
      pthread_key_create[lVar2] = (code)0x30;
      *(long *)(fmod + *(long *)(std::cout + -0x18)) = (long)digit_num;
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"... ",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if (swap_fg_bg == true) {
        local_118 = (ppVar13->second).format;
        local_128._0_4_ = (ppVar13->second).id;
        local_128._4_4_ = (ppVar13->second).width;
        uStack_120._0_4_ = (ppVar13->second).height;
        uStack_120._4_4_ = (ppVar13->second).mipmaps;
        local_138 = (ppVar13->first).format;
        local_148._0_4_ = (ppVar13->first).id;
        local_148._4_4_ = (ppVar13->first).width;
        uStack_140._0_4_ = (ppVar13->first).height;
        uStack_140._4_4_ = (ppVar13->first).mipmaps;
        if (ppVar13 != *(pointer *)CONCAT44(uStack_1d4,iVar16)) {
          ppVar9 = ppVar13 + -1;
          local_1a8[0].format = ppVar13[-1].second.format;
          local_1a8[0].id = ppVar13[-1].second.id;
          local_1a8[0].width = ppVar13[-1].second.width;
          local_1a8[0].height = ppVar13[-1].second.height;
          local_1a8[0].mipmaps = ppVar13[-1].second.mipmaps;
LAB_0010b2e8:
          local_168.format = (ppVar9->first).format;
          local_168.id = (ppVar9->first).id;
          local_168.width = (ppVar9->first).width;
          local_168.height = (ppVar9->first).height;
          local_168.mipmaps = (ppVar9->first).mipmaps;
        }
      }
      else {
        local_118 = (ppVar13->first).format;
        local_128._0_4_ = (ppVar13->first).id;
        local_128._4_4_ = (ppVar13->first).width;
        uStack_120._0_4_ = (ppVar13->first).height;
        uStack_120._4_4_ = (ppVar13->first).mipmaps;
        local_138 = (ppVar13->second).format;
        local_148._0_4_ = (ppVar13->second).id;
        local_148._4_4_ = (ppVar13->second).width;
        uStack_140._0_4_ = (ppVar13->second).height;
        uStack_140._4_4_ = (ppVar13->second).mipmaps;
        if (ppVar13 != *(pointer *)CONCAT44(uStack_1d4,iVar16)) {
          local_1a8[0].format = ppVar13[-1].first.format;
          local_1a8[0].id = ppVar13[-1].first.id;
          local_1a8[0].width = ppVar13[-1].first.width;
          local_1a8[0].height = ppVar13[-1].first.height;
          local_1a8[0].mipmaps = ppVar13[-1].first.mipmaps;
          ppVar9 = (pointer)&ppVar13[-1].second;
          goto LAB_0010b2e8;
        }
      }
      if (1 < (ulong)(((long)(out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        image._4_8_ = in_stack_fffffffffffffe14;
        image.data._0_4_ = in_stack_fffffffffffffe10;
        image.height = (int)in_stack_fffffffffffffe1c;
        image.mipmaps = (int)((ulong)in_stack_fffffffffffffe1c >> 0x20);
        image.format = iVar15;
        LoadTextureFromImage(image);
        uVar11 = ((long)(out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar11 < num_frames_back || uVar11 - num_frames_back == 0) {
          image_01._4_8_ = in_stack_fffffffffffffe14;
          image_01.data._0_4_ = in_stack_fffffffffffffe10;
          image_01.height = (int)in_stack_fffffffffffffe1c;
          image_01.mipmaps = (int)((ulong)in_stack_fffffffffffffe1c >> 0x20);
          image_01.format = iVar15;
          LoadTextureFromImage(image_01);
          local_1b8 = local_100.mipmaps;
          local_1c8 = local_100.data;
          iStack_1c0 = local_100.width;
          iStack_1bc = local_100.height;
        }
        else {
          image_00._4_8_ = in_stack_fffffffffffffe14;
          image_00.data._0_4_ = in_stack_fffffffffffffe10;
          image_00.height = (int)in_stack_fffffffffffffe1c;
          image_00.mipmaps = (int)((ulong)in_stack_fffffffffffffe1c >> 0x20);
          image_00.format = iVar15;
          LoadTextureFromImage(image_00);
        }
      }
      target_02.texture.id = local_60.depth.width;
      target_02.id = local_60.depth.id;
      target_02.texture.width = local_60.depth.height;
      target_02.texture.height = local_60.depth.mipmaps;
      target_02.texture.mipmaps = local_60.depth.format;
      target_02.texture.format = (int)in_stack_fffffffffffffe14;
      target_02.depth.id = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
      target_02.depth.width = (int)in_stack_fffffffffffffe1c;
      target_02.depth.height = (int)((ulong)in_stack_fffffffffffffe1c >> 0x20);
      target_02.depth.mipmaps = iVar15;
      target_02.depth.format = iVar16;
      iVar7 = local_60.texture.format;
      uVar14 = local_60.depth.id;
      BeginTextureMode(target_02);
      ClearBackground((Color)0xffffffff);
      texture.height = (undefined4)uStack_120;
      texture.mipmaps = uStack_120._4_4_;
      texture.id = (undefined4)local_128;
      texture.width = local_128._4_4_;
      texture.format = local_118;
      DrawTexture(texture,0,0,(Color)0xffffffff);
      texture_00.height = local_1a8[0].height;
      texture_00.mipmaps = local_1a8[0].mipmaps;
      texture_00.id = local_1a8[0].id;
      texture_00.width = local_1a8[0].width;
      texture_00.format = local_1a8[0].format;
      DrawTexture(texture_00,(int)res.x,0,(Color)0xffffffff);
      texture_01.height = (undefined4)uStack_140;
      texture_01.mipmaps = uStack_140._4_4_;
      texture_01.id = (undefined4)local_148;
      texture_01.width = local_148._4_4_;
      texture_01.format = local_138;
      DrawTexture(texture_01,0,(int)res.y,(Color)0xffffffff);
      texture_02.height = local_168.height;
      texture_02.mipmaps = local_168.mipmaps;
      texture_02.id = local_168.id;
      texture_02.width = local_168.width;
      texture_02.format = local_168.format;
      DrawTexture(texture_02,(int)res.x,(int)res.y,(Color)0xffffffff);
      DrawTexture(texture_09,0,(int)(res.y + res.y),(Color)0xffffffff);
      texture_03.height = iStack_1c0;
      texture_03.mipmaps = iStack_1bc;
      texture_03._0_8_ = local_1c8;
      texture_03.format = local_1b8;
      DrawTexture(texture_03,(int)res.x,(int)(res.y + res.y),(Color)0xffffffff);
      EndTextureMode();
      texture_06.mipmaps = iVar7;
      texture_06.format = uVar14;
      UnloadTexture(texture_06);
      texture_07.height = local_1b8;
      texture_07.id = iStack_1c0;
      texture_07.width = iStack_1bc;
      texture_07.mipmaps = iVar7;
      texture_07.format = uVar14;
      UnloadTexture(texture_07);
      shader._4_4_ = 0;
      shader.id = uVar10;
      shader.locs = piVar12;
      iVar7 = GetShaderLocation(shader,"progress");
      shader_00._4_4_ = 0;
      shader_00.id = uVar10;
      shader_00.locs = piVar12;
      SetShaderValue(shader_00,iVar7,&stack0xfffffffffffffe24,4);
      in_stack_fffffffffffffe10 = local_90.depth.format;
      target_03.texture.id = local_90.depth.width;
      target_03.id = local_90.depth.id;
      target_03.texture.width = local_90.depth.height;
      target_03.texture.height = local_90.depth.mipmaps;
      target_03.texture.mipmaps = in_stack_fffffffffffffe10;
      target_03.texture.format = (int)in_stack_fffffffffffffe14;
      target_03.depth.id = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
      target_03.depth.width = (int)in_stack_fffffffffffffe1c;
      target_03.depth.height = (int)((ulong)in_stack_fffffffffffffe1c >> 0x20);
      target_03.depth.mipmaps = iVar15;
      target_03.depth.format = iVar16;
      BeginTextureMode(target_03);
      ClearBackground((Color)0xffffffff);
      shader_01._4_4_ = 0;
      shader_01.id = uVar10;
      shader_01.locs = piVar12;
      BeginShaderMode(shader_01);
      local_98 = local_60.texture.format;
      texture_04.width = local_60.texture.width;
      texture_04.id = local_60.texture.id;
      texture_04.mipmaps = local_60.texture.mipmaps;
      texture_04.height = local_60.texture.height;
      texture_04.format = local_60.texture.format;
      DrawTexture(texture_04,0,0,(Color)0xffffffff);
      EndShaderMode();
      EndTextureMode();
      local_b8 = local_90.texture.format;
      texture_08.width = (int)in_stack_fffffffffffffe14;
      texture_08.height = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
      texture_08.id = in_stack_fffffffffffffe10;
      texture_08.mipmaps = (int)in_stack_fffffffffffffe1c;
      texture_08.format = (int)((ulong)in_stack_fffffffffffffe1c >> 0x20);
      GetTextureData(texture_08);
      __position._M_current =
           (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Image,_std::allocator<Image>_>::_M_realloc_insert<Image>
                  (out_buf,__position,&local_100);
      }
      else {
        (__position._M_current)->mipmaps = local_100.mipmaps;
        (__position._M_current)->format = local_100.format;
        (__position._M_current)->data = local_100.data;
        (__position._M_current)->width = local_100.width;
        (__position._M_current)->height = local_100.height;
        ppIVar1 = &(out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      BeginDrawing();
      local_d8 = local_90.texture.format;
      texture_05.width = local_90.texture.width;
      texture_05.id = local_90.texture.id;
      texture_05.mipmaps = local_90.texture.mipmaps;
      texture_05.height = local_90.texture.height;
      texture_05.format = local_90.texture.format;
      DrawTexture(texture_05,0,0,(Color)0xffffffff);
      EndDrawing();
      iVar15 = iVar15 + 1;
      ppVar13 = ppVar13 + 1;
    } while (ppVar13 != *(pointer *)(CONCAT44(uStack_1d4,iVar16) + 8));
  }
  target_00.texture.id = local_60.texture.height;
  target_00.id = local_60.texture.width;
  target_00.texture.width = local_60.texture.mipmaps;
  target_00.texture.height = local_60.texture.format;
  target_00.texture.mipmaps = local_60.depth.id;
  target_00.texture.format = local_60.depth.width;
  target_00.depth.id = local_60.depth.height;
  target_00.depth.width = local_60.depth.mipmaps;
  target_00.depth.height = local_60.depth.format;
  target_00.depth.mipmaps = (int)in_stack_fffffffffffffe14;
  target_00.depth.format = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
  UnloadRenderTexture(target_00);
  target_01.texture.id = local_90.texture.height;
  target_01.id = local_90.texture.width;
  target_01.texture.width = local_90.texture.mipmaps;
  target_01.texture.height = local_90.texture.format;
  target_01.texture.mipmaps = local_90.depth.id;
  target_01.texture.format = local_90.depth.width;
  target_01.depth.id = local_90.depth.height;
  target_01.depth.width = local_90.depth.mipmaps;
  target_01.depth.height = local_90.depth.format;
  target_01.depth.mipmaps = (int)in_stack_fffffffffffffe14;
  target_01.depth.format = (int)((ulong)in_stack_fffffffffffffe14 >> 0x20);
  UnloadRenderTexture(target_01);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (out_buf->super__Vector_base<Image,_std::allocator<Image>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> process_textures(
	std::vector<std::pair<Texture2D,Texture2D>> tex_buf,
	std::pair<Texture2D,Texture2D> last_batch_pair,
	std::vector<Image> out_buf,
	Shader s,
	int starting_index)
{

	// Create a RenderTexture2D to use as a canvas
    RenderTexture2D sampler = LoadRenderTexture(res.x*2, res.y*3);
	RenderTexture2D target = LoadRenderTexture(res.x, res.y);
	
	//iterate through all the textures in the vector
	int log_index = starting_index;
	Texture2D fg, bg;
	Texture2D fg_previous = last_batch_pair.first;
	Texture2D bg_previous = last_batch_pair.second;
	Texture2D processed_previous = tex_buf.front().first;
	Texture2D processed_older = tex_buf.front().second;

	std::cout << "processing inputs " << starting_index
		<< " to " << (starting_index+tex_buf.size()) << std::endl;
	for (auto it = tex_buf.begin(); it != tex_buf.end(); ++it) {
		std::cout << "\tprocessing "
			<< std::setfill('0') << std::setw(digit_num) << log_index
			<< "/" << out_buf.size() << "... " << std::endl;

		if (swap_fg_bg) {
			fg = it->second;
			bg = it->first;
			if (it != tex_buf.begin()) {
				fg_previous = (it-1)->second;
				bg_previous = (it-1)->first;
			}
		} else {
			fg = it->first;
			bg = it->second;
			if (it != tex_buf.begin()) {
				fg_previous = (it-1)->first;
				bg_previous = (it-1)->second;
			}
		}


		if (out_buf.size() > 1) {
			processed_previous = LoadTextureFromImage(*(out_buf.end()-1));
			//if num_frames_back > out.size,
			//return the texture using modulo operation
			if (out_buf.size() > num_frames_back) {
				processed_older
					= LoadTextureFromImage(*(out_buf.end()-1-num_frames_back));
			} else processed_older = LoadTextureFromImage(out_buf.back());
		}

		/* raylib doesn't allow uploading sampler2Ds to GPU.
		 * so instead, I draw the necessary textures to a very tall render
		 * texture called "sampler with textures arranged like this:
		 * 		current foreground texture	|	previous foreground texture
		 * 		current background texture	|	previous background texture
		 * 		previous processed texture	|	older processed texture
		 */
		BeginTextureMode(sampler);
			ClearBackground(WHITE);
			DrawTexture(fg, 				0, 		0, 			WHITE);
			DrawTexture(fg_previous, 		res.x, 	0, 			WHITE);
			DrawTexture(bg, 				0, 		res.y,		WHITE);
			DrawTexture(bg_previous,		res.x,	res.y,		WHITE);
			DrawTexture(processed_previous,	0,		res.y*2,	WHITE);
			DrawTexture(processed_older,	res.x,	res.y*2,	WHITE);
		EndTextureMode();
		
		//unload the temporary textures
		UnloadTexture(processed_previous);
		UnloadTexture(processed_older);

		SetShaderValue(
			s,
			GetShaderLocation(s, "progress"),
			&log_index,
			SHADER_UNIFORM_INT
		);

		//now apply the shader and render to target texture
		BeginTextureMode(target);
			ClearBackground(WHITE);
			BeginShaderMode(s);
				DrawTexture(sampler.texture, 0, 0, WHITE);
			EndShaderMode();
		EndTextureMode();

		out_buf.push_back(GetTextureData(target.texture));
		
		//finally, draw on the screen
		BeginDrawing();
			DrawTexture(target.texture, 0, 0, WHITE);
		EndDrawing();

		++log_index;
	}

	UnloadRenderTexture(sampler);
	UnloadRenderTexture(target);

	std::cout << std::endl;
	return out_buf;
}